

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

int32_t uprv_ebcdicFromAscii_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  byte bVar1;
  UBool UVar2;
  int local_50;
  int32_t count;
  uint8_t c;
  uint8_t *t;
  uint8_t *s;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*pErrorCode), UVar2 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if ((((ds == (UDataSwapper *)0x0) || (inData == (void *)0x0)) || (length < 0)) ||
          ((local_50 = length, _count = (uint8_t *)outData, t = (uint8_t *)inData, 0 < length &&
           (outData == (void *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    ds_local._4_4_ = 0;
  }
  else {
    for (; ds_local._4_4_ = length, 0 < local_50; local_50 = local_50 + -1) {
      bVar1 = *t;
      if ((0x7f < bVar1) || ((invariantChars[(int)(uint)bVar1 >> 5] & 1 << (bVar1 & 0x1f)) == 0)) {
        udata_printError_63(ds,
                            "uprv_ebcdicFromAscii() string[%d] contains a variant character in position %d\n"
                            ,(ulong)(uint)length,(ulong)(uint)(length - local_50));
        *pErrorCode = U_INVALID_CHAR_FOUND;
        return 0;
      }
      *_count = ""[bVar1];
      _count = _count + 1;
      t = t + 1;
    }
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_ebcdicFromAscii(const UDataSwapper *ds,
                     const void *inData, int32_t length, void *outData,
                     UErrorCode *pErrorCode) {
    const uint8_t *s;
    uint8_t *t;
    uint8_t c;

    int32_t count;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    s=(const uint8_t *)inData;
    t=(uint8_t *)outData;
    count=length;
    while(count>0) {
        c=*s++;
        if(!UCHAR_IS_INVARIANT(c)) {
            udata_printError(ds, "uprv_ebcdicFromAscii() string[%d] contains a variant character in position %d\n",
                             length, length-count);
            *pErrorCode=U_INVALID_CHAR_FOUND;
            return 0;
        }
        *t++=ebcdicFromAscii[c];
        --count;
    }

    return length;
}